

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O3

void mpifft1d_dif(int *dim,int *pdim,int ndim,int current_dim,int *pidx,int inverse,int size,
                 int *embed,cpx_t *in,cpx_t *out,plan_t plan_short,plan_t plan_long,int *rho_L,
                 int *rho_pk0,int *rho_Lk0,int *dfft_nsend,int *dfft_nrecv,int *dfft_offset_send,
                 int *dfft_offset_recv,MPI_Comm comm,int *proc_map,int row_m)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  cpx_t cVar5;
  int iVar6;
  ulong uVar7;
  int c0;
  int iVar8;
  ulong uVar9;
  int iVar10;
  cpx_t *pcVar11;
  float *pfVar12;
  cpx_t *in_00;
  ulong uVar13;
  float fVar14;
  double theta;
  
  iVar1 = pdim[current_dim];
  iVar2 = dim[current_dim];
  iVar6 = (int)((long)size / (long)embed[current_dim]);
  iVar10 = (int)((long)iVar2 / (long)iVar1);
  c0 = iVar10;
  if (1 < iVar1) {
    uVar13 = (long)size / (long)embed[current_dim] & 0xffffffff;
    iVar8 = iVar1;
    do {
      c0 = iVar8;
      uVar9 = uVar13;
      pcVar11 = out;
      in_00 = in;
      if (0 < iVar6) {
        do {
          dfft_local_1dfft(in_00,pcVar11,plan_long,inverse);
          pcVar11 = pcVar11 + 1;
          in_00 = in_00 + 1;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      if (0 < iVar10) {
        iVar8 = pidx[current_dim];
        uVar9 = 0;
        pfVar12 = &out->y;
        pcVar11 = in;
        do {
          dVar3 = (double)(int)uVar9 *
                  ((((double)(iVar8 % c0) / (double)c0) * -6.283185307179586) / (double)iVar10);
          dVar4 = cos(dVar3);
          dVar3 = sin(dVar3);
          if (0 < iVar6) {
            fVar14 = (float)dVar3;
            if (inverse != 0) {
              fVar14 = -fVar14;
            }
            uVar7 = 0;
            do {
              cVar5.y = pfVar12[uVar7 * 2 + -1] * fVar14 + (float)dVar4 * pfVar12[uVar7 * 2];
              cVar5.x = pfVar12[uVar7 * 2 + -1] * (float)dVar4 + -pfVar12[uVar7 * 2] * fVar14;
              pcVar11[uVar7] = cVar5;
              uVar7 = uVar7 + 1;
            } while (uVar13 != uVar7);
          }
          uVar9 = uVar9 + 1;
          pcVar11 = pcVar11 + uVar13;
          pfVar12 = pfVar12 + uVar13 * 2;
        } while (uVar9 != ((long)iVar2 / (long)iVar1 & 0xffffffffU));
      }
      iVar8 = 1;
      if (iVar10 < c0) {
        iVar8 = c0 / iVar10;
      }
      dfft_redistribute_cyclic_to_block_1d
                (dim,pdim,ndim,current_dim,c0,iVar8,pidx,1,size,embed,in,out,rho_L,rho_pk0,
                 dfft_nsend,dfft_nrecv,dfft_offset_send,dfft_offset_recv,comm,proc_map,row_m);
      iVar8 = c0 / iVar10;
    } while (1 < c0 / iVar10);
  }
  uVar13 = (long)(iVar6 * iVar10) / (long)c0;
  if (0 < (int)uVar13) {
    uVar13 = uVar13 & 0xffffffff;
    do {
      dfft_local_1dfft(in,out,plan_short,inverse);
      out = out + 1;
      in = in + 1;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  return;
}

Assistant:

void mpifft1d_dif(int *dim,
            int *pdim,
            int ndim,
            int current_dim,
            int* pidx,
            int inverse,
            int size,
            int *embed,
            cpx_t *in,
            cpx_t *out,
            plan_t plan_short,
            plan_t plan_long,
            int *rho_L,
            int *rho_pk0,
            int *rho_Lk0,
            int *dfft_nsend,
            int *dfft_nrecv,
            int *dfft_offset_send,
            int *dfft_offset_recv,
            MPI_Comm comm,
            int *proc_map,
            int row_m)
    {
    int p = pdim[current_dim];
    int length = dim[current_dim]/pdim[current_dim];
    int st = size/embed[current_dim]*(dim[current_dim]/pdim[current_dim]);

    /* compute stride for column major matrix storage */
    int stride = size/embed[current_dim];

    int c;
    int k0 = length;
    for (c = p; c >1; c /= length)
        {
#if 1
        /* do local out-of-place place FFT (long-distance butterflies) */
        #ifdef FFT1D_SUPPORTS_THREADS
        dfft_local_1dfft(in, out, plan_long, inverse);
        #else
        int i;
        #pragma omp parallel for
        for (i = 0; i < st/length; ++i)
            dfft_local_1dfft(in+i, out+i, plan_long, inverse);
        #endif
        /* apply twiddle factors */
        double alpha = ((double)(pidx[current_dim] %c))/(double)c;
        int j;
        #pragma omp parallel for private(j)
        for (j = 0; j < length; j++)
            {
            double theta = -(double)2.0 * (double)M_PI * alpha/(double) length;
            cpx_t w;
            RE(w) = cos((double)j*theta);
            IM(w) = sin((double)j*theta);

            double sign = ((inverse) ? (-1.0) : 1.0);
            IM(w) *=sign;

            int r;
            for (r = 0; r < stride; ++r)
                {
                cpx_t x = out[j*stride+r];
                cpx_t y;
                RE(y) = RE(x) * RE(w) - IM(x) * IM(w);
                IM(y) = RE(x) * IM(w) + IM(x) * RE(w);

                in[j*stride+r] = y;
                }
            }
        int rev = 1;
#else
        int rev = 0;
#endif

        /* in-place redistribute from group-cyclic c -> c1 */
        int c1 = ((c > length) ? (c/length) : 1);
        k0 = c;
        dfft_redistribute_cyclic_to_block_1d(dim,pdim,ndim,current_dim, c, c1,
            pidx, rev, size, embed, in,out,rho_L,rho_pk0,
            dfft_nsend,dfft_nrecv,dfft_offset_send,dfft_offset_recv,
            comm, proc_map, row_m);
        }

    /* perform remaining short-distance butterflies,
     * out-of-place 1d FFT */
    #ifdef FFT1D_SUPPORTS_THREADS
    dfft_local_1dfft(in, out, plan_short,inverse);
    #else
    int i;
    #pragma omp parallel for
    for (i = 0; i < st/k0; ++i)
        dfft_local_1dfft(in+i, out+i, plan_short, inverse);
    #endif
    }